

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

GLenum __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreDataAlignmentTest::Create2DR8UITexture
          (ImageLoadStoreDataAlignmentTest *this,GLuint width,GLuint height,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *texture_data,GLuint *out_texture_id
          )

{
  GLuint height_00;
  GLuint width_00;
  const_reference pixels;
  GLuint local_38;
  GLenum local_34;
  GLuint texture_id;
  GLenum err;
  GLuint *out_texture_id_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *texture_data_local;
  GLuint height_local;
  GLuint width_local;
  ImageLoadStoreDataAlignmentTest *this_local;
  
  local_34 = 0;
  local_38 = 0;
  _texture_id = out_texture_id;
  out_texture_id_local = (GLuint *)texture_data;
  texture_data_local._0_4_ = height;
  texture_data_local._4_4_ = width;
  _height_local = this;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&local_38);
  local_34 = glu::CallLogWrapper::glGetError
                       (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper);
  this_local._4_4_ = local_34;
  if (local_34 == 0) {
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,local_38);
    local_34 = glu::CallLogWrapper::glGetError
                         (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                           super_CallLogWrapper);
    width_00 = texture_data_local._4_4_;
    height_00 = (GLuint)texture_data_local;
    if (local_34 == 0) {
      pixels = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          out_texture_id_local,0);
      glu::CallLogWrapper::glTexImage2D
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0,0x8232,width_00,height_00,0,0x8d94,0x1401,pixels);
      local_34 = glu::CallLogWrapper::glGetError
                           (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.
                             super_GLWrapper.super_CallLogWrapper);
      if (local_34 == 0) {
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0x813c,0);
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0x813d,0);
        glu::CallLogWrapper::glTexParameteri
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0xde1,0x2801,0x2601);
        local_34 = glu::CallLogWrapper::glGetError
                             (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.
                               super_GLWrapper.super_CallLogWrapper);
        if (local_34 == 0) {
          *_texture_id = local_38;
          this_local._4_4_ = 0;
        }
        else {
          glu::CallLogWrapper::glDeleteTextures
                    (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1,&local_38);
          this_local._4_4_ = local_34;
        }
      }
      else {
        glu::CallLogWrapper::glDeleteTextures
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&local_38);
        this_local._4_4_ = local_34;
      }
    }
    else {
      glu::CallLogWrapper::glDeleteTextures
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&local_38);
      this_local._4_4_ = local_34;
    }
  }
  return this_local._4_4_;
}

Assistant:

GLenum Create2DR8UITexture(GLuint width, GLuint height, const std::vector<GLubyte>& texture_data,
							   GLuint& out_texture_id)
	{
		GLenum err		  = 0;
		GLuint texture_id = 0;

		/* Generate texture */
		glGenTextures(1, &texture_id);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			return err;
		}

		/* Bind texture */
		glBindTexture(GL_TEXTURE_2D, texture_id);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Allocate storage and fill texture */
		glTexImage2D(GL_TEXTURE_2D, 0 /* level */, GL_R8UI, width, height, 0 /* border */, GL_RED_INTEGER,
					 GL_UNSIGNED_BYTE, &texture_data[0]);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Make texture complete */
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 0);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 0);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		err = glGetError();
		if (GL_NO_ERROR != err)
		{
			glDeleteTextures(1, &texture_id);
			return err;
		}

		/* Set out_texture_id */
		out_texture_id = texture_id;

		/* Done */
		return GL_NO_ERROR;
	}